

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
PlayerInfoIRCCommand::trigger
          (PlayerInfoIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  size_t lhs;
  char *pcVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  Server *pSVar7;
  size_t sVar8;
  char *pcVar9;
  string_view *psVar10;
  size_t sVar11;
  string *psVar12;
  Server *pSVar13;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  long local_90;
  string msg;
  string_view player_info_format;
  
  pcVar9 = channel._M_str;
  sVar11 = channel._M_len;
  lVar4 = Jupiter::IRC::Client::getChannel(source,sVar11,pcVar9);
  if (lVar4 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    msg._M_dataplus._M_p = (pointer)&msg.field_2;
    msg._M_string_length = 0;
    msg.field_2._M_local_buf[0] = '\0';
    iVar3 = Jupiter::IRC::Client::getAccessLevel(source,sVar11,pcVar9,nick._M_len,nick._M_str);
    pcVar1 = parameters._M_str;
    lhs = parameters._M_len;
    psVar10 = &parameters;
    psVar12 = &pluginInstance.m_playerInfoFormat;
    if (1 < iVar3) {
      psVar12 = &pluginInstance.m_adminPlayerInfoFormat;
    }
    player_info_format._M_str = (psVar12->_M_dataplus)._M_p;
    psVar12 = &pluginInstance.m_playerInfoFormat;
    if (1 < iVar3) {
      psVar12 = &pluginInstance.m_adminPlayerInfoFormat;
    }
    player_info_format._M_len = psVar12->_M_string_length;
    if (parameters._M_len == 0) {
      local_90 = 0;
      while( true ) {
        RenX::getCore();
        lVar4 = RenX::Core::getServerCount();
        if (local_90 == lVar4) break;
        uVar6 = RenX::getCore();
        pSVar7 = (Server *)RenX::Core::getServer(uVar6);
        cVar2 = RenX::Server::isLogChanType((int)pSVar7);
        local_90 = local_90 + 1;
        if ((cVar2 != '\0') && (*(long *)(pSVar7 + 0x20) != 0)) {
          pSVar13 = pSVar7 + 0x10;
          while (pSVar13 = *(Server **)pSVar13, pSVar13 != pSVar7 + 0x10) {
            std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&msg,&player_info_format);
            RenX::processTags((string *)&msg,pSVar7,(PlayerInfo *)(pSVar13 + 0x10),(PlayerInfo *)0x0
                              ,(BuildingInfo *)0x0);
            Jupiter::IRC::Client::sendMessage(source,sVar11,pcVar9);
          }
        }
      }
    }
    else {
      lVar4 = 0;
      while( true ) {
        RenX::getCore();
        lVar5 = RenX::Core::getServerCount();
        if (lVar4 == lVar5) break;
        uVar6 = RenX::getCore();
        pSVar7 = (Server *)RenX::Core::getServer(uVar6);
        cVar2 = RenX::Server::isLogChanType((int)pSVar7);
        lVar4 = lVar4 + 1;
        if ((cVar2 != '\0') && (*(long *)(pSVar7 + 0x20) != 0)) {
          pSVar13 = pSVar7 + 0x10;
          while (pSVar13 = *(Server **)pSVar13, pSVar13 != pSVar7 + 0x10) {
            rhs._M_str = (char *)psVar10;
            rhs._M_len = (size_t)pcVar1;
            sVar8 = jessilib::findi<char,char>
                              ((jessilib *)(pSVar13 + 0x18),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               lhs,rhs);
            if (sVar8 != 0xffffffffffffffff) {
              std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                        ((string *)&msg,&player_info_format);
              RenX::processTags((string *)&msg,pSVar7,(PlayerInfo *)(pSVar13 + 0x10),
                                (PlayerInfo *)0x0,(BuildingInfo *)0x0);
              psVar10 = (string_view *)msg._M_string_length;
              Jupiter::IRC::Client::sendMessage(source,sVar11,pcVar9);
            }
          }
        }
      }
    }
    if (msg._M_string_length == 0) {
      Jupiter::IRC::Client::sendNotice
                (source,nick._M_len,nick._M_str,0x18,"Error: Player not found.");
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

void PlayerInfoIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr) {
		int type = chan->getType();
		std::string msg;
		RenX::Server *server;
		std::string_view player_info_format = source->getAccessLevel(channel, nick) > 1 ? pluginInstance.getAdminPlayerInfoFormat() : pluginInstance.getPlayerInfoFormat();
		size_t index = 0;

		if (parameters.empty()) { // List all players
			while (index != RenX::getCore()->getServerCount()) {
				server = RenX::getCore()->getServer(index++);
				if (server->isLogChanType(type) && server->players.size() != 0) {
					for (auto node = server->players.begin(); node != server->players.end(); ++node) {
						msg = player_info_format;
						RenX::processTags(msg, server, &*node);
						source->sendMessage(channel, msg);
					}
				}
			}
		}
		else { // List all partial matches
			while (index != RenX::getCore()->getServerCount()) {
				server = RenX::getCore()->getServer(index++);
				if (server->isLogChanType(type) && server->players.size() != 0) {
					for (auto node = server->players.begin(); node != server->players.end(); ++node) {
						if (jessilib::findi(node->name, std::string_view{parameters}) != std::string::npos) {
							msg = player_info_format;
							RenX::processTags(msg, server, &*node);
							source->sendMessage(channel, msg);
						}
					}
				}
			}
		}

		if (msg.empty()) {
			source->sendNotice(nick, "Error: Player not found."sv);
		}
	}
}